

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O0

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::
handle_pre_init(connection<websocketpp::config::asio::transport_config> *this,init_handler *callback
               ,error_code *ec)

{
  bool bVar1;
  element_type *peVar2;
  ulong uVar3;
  size_t in_RCX;
  error_code *in_RDX;
  long in_RDI;
  init_handler *in_stack_000000b8;
  connection<websocketpp::config::asio::transport_config> *in_stack_000000c0;
  init_handler *in_stack_00000158;
  connection<websocketpp::config::asio::transport_config> *in_stack_00000160;
  error_code *in_stack_ffffffffffffff58;
  function<void_(const_std::error_code_&)> *in_stack_ffffffffffffff60;
  function<void_(const_std::error_code_&)> *in_stack_ffffffffffffff68;
  function<void_(const_std::error_code_&)> *in_stack_ffffffffffffff70;
  function<void_(const_std::error_code_&)> local_28;
  
  local_28.super__Function_base._M_manager = (_Manager_type)in_RDX;
  peVar2 = std::
           __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x304d8a);
  bVar1 = log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::static_test
                    (peVar2,0x400);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x304dab);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (peVar2,0x400,"asio connection handle pre_init",in_RCX);
  }
  bVar1 = std::function::operator_cast_to_bool((function<void_(std::weak_ptr<void>)> *)0x304dd0);
  if (bVar1) {
    in_stack_ffffffffffffff68 = (function<void_(const_std::error_code_&)> *)(in_RDI + 0x100);
    in_stack_ffffffffffffff70 = &local_28;
    std::weak_ptr<void>::weak_ptr
              ((weak_ptr<void> *)in_stack_ffffffffffffff60,
               (weak_ptr<void> *)in_stack_ffffffffffffff58);
    std::function<void_(std::weak_ptr<void>)>::operator()
              ((function<void_(std::weak_ptr<void>)> *)in_stack_ffffffffffffff70,
               (weak_ptr<void> *)in_stack_ffffffffffffff68);
    std::weak_ptr<void>::~weak_ptr((weak_ptr<void> *)0x304e20);
  }
  bVar1 = std::error_code::operator_cast_to_bool
                    ((error_code *)local_28.super__Function_base._M_manager);
  if (bVar1) {
    std::function<void_(const_std::error_code_&)>::operator()
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::function<void_(const_std::error_code_&)>::function
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    proxy_write(in_stack_00000160,in_stack_00000158);
    std::function<void_(const_std::error_code_&)>::~function
              ((function<void_(const_std::error_code_&)> *)0x304eab);
  }
  else {
    std::function<void_(const_std::error_code_&)>::function
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    post_init(in_stack_000000c0,in_stack_000000b8);
    std::function<void_(const_std::error_code_&)>::~function
              ((function<void_(const_std::error_code_&)> *)0x304ef4);
  }
  return;
}

Assistant:

void handle_pre_init(init_handler callback, lib::error_code const & ec) {
        if (m_alog->static_test(log::alevel::devel)) {
            m_alog->write(log::alevel::devel,"asio connection handle pre_init");
        }

        if (m_tcp_pre_init_handler) {
            m_tcp_pre_init_handler(m_connection_hdl);
        }

        if (ec) {
            callback(ec);
        }

        // If we have a proxy set issue a proxy connect, otherwise skip to
        // post_init
        if (!m_proxy.empty()) {
            proxy_write(callback);
        } else {
            post_init(callback);
        }
    }